

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

void __thiscall
despot::SemiChainBelief::SemiChainBelief
          (SemiChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions)

{
  long lVar1;
  ulong uVar2;
  void *local_48;
  long lStack_40;
  long local_38;
  
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__SemiChainBelief_0010ea90;
  (this->alpha_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->alpha_,(long)num_mdp_actions);
  if (0 < num_mdp_actions) {
    uVar2 = 0;
    do {
      local_48 = (void *)0x0;
      lStack_40 = 0;
      local_38 = 0;
      local_48 = operator_new(0x10);
      lStack_40 = (long)local_48 + 0x10;
      lVar1 = 0;
      do {
        *(undefined8 *)((long)local_48 + lVar1) = 0x3ff0000000000000;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x10);
      local_38 = lStack_40;
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((this->alpha_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2,&local_48);
      if (local_48 != (void *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)num_mdp_actions);
  }
  return;
}

Assistant:

SemiChainBelief::SemiChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_actions);
	for (int a = 0; a < num_mdp_actions; a++) {
		alpha_[a] = vector<double>(2, 1.0);
	}
}